

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast_pybind_kukakr120r2500pro.cpp
# Opt level: O1

PyObject * PyInit_ikfast_kukakr120r2500pro(void)

{
  handle hVar1;
  int iVar2;
  char *__s1;
  function_record *pfVar3;
  handle hVar4;
  cpp_function func;
  module m;
  cpp_function func_1;
  cpp_function func_2;
  handle local_78;
  handle local_70;
  handle local_68;
  byte local_60;
  handle local_58;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  object local_30;
  
  __s1 = (char *)Py_GetVersion();
  iVar2 = strncmp(__s1,"3.10",4);
  if ((iVar2 == 0) && (9 < (byte)(__s1[4] - 0x30U))) {
    pybind11::module::module((module *)&local_70,"ikfast_kukakr120r2500pro",(char *)0x0);
    local_50.obj.m_ptr = local_70.m_ptr;
    local_50.key = "__doc__";
    local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              (&local_50,
               (char (*) [229])
               "\n        ikfast_pybind_kukakr120r2500pro\n        -----------------------\n        .. currentmodule:: ikfast_pybind_kukakr120r2500pro\n        .. autosummary::\n           :toctree: _generate\n           get_ik\n           get_fk\n    "
              );
    pybind11::object::~object((object *)&local_50.cache.super_handle);
    hVar1.m_ptr = local_70.m_ptr;
    local_50._0_8_ = "trans_list";
    local_50.obj.m_ptr = (PyObject *)((ulong)local_50.obj.m_ptr & 0xfffffffffffffffc | 2);
    local_68.m_ptr = (PyObject *)0x1321dd;
    local_60 = local_60 & 0xfc | 2;
    local_30.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    local_58.m_ptr = (PyObject *)PyObject_GetAttrString(local_70.m_ptr,"get_ik");
    if (local_58.m_ptr == (PyObject *)0x0) {
      PyErr_Clear();
      local_58.m_ptr = (PyObject *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
    }
    hVar4.m_ptr = local_58.m_ptr;
    local_78.m_ptr = (PyObject *)0x0;
    pfVar3 = pybind11::cpp_function::make_function_record((cpp_function *)&local_78);
    pfVar3->impl = pybind11::cpp_function::
                   initialize<pybind11_init_ikfast_kukakr120r2500pro(pybind11::module&)::$_0,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::vector<double,std::allocator<double>>const&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg,char[75]>(pybind11_init_ikfast_kukakr120r2500pro(pybind11::module&)::$_0&&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>(*)(std::vector<double,std::allocator<double>>const&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,pybind11::arg_const&,char_const(&)[75])
                   ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    pfVar3->name = "get_ik";
    (pfVar3->scope).m_ptr = hVar1.m_ptr;
    (pfVar3->sibling).m_ptr = hVar4.m_ptr;
    pybind11::detail::process_attribute<pybind11::arg,_void>::init
              ((process_attribute<pybind11::arg,_void> *)&local_50,(EVP_PKEY_CTX *)pfVar3);
    pybind11::detail::process_attribute<pybind11::arg,_void>::init
              ((process_attribute<pybind11::arg,_void> *)&local_68,(EVP_PKEY_CTX *)pfVar3);
    pfVar3->doc = "\n        get inverse kinematic solutions for pybind_kukakr120r2500pro\n    ";
    pybind11::cpp_function::initialize_generic
              ((cpp_function *)&local_78,pfVar3,
               "({List[float]}, {List[List[float]]}) -> List[List[float]]",
               (type_info **)
               &pybind11::cpp_function::
                initialize<pybind11_init_ikfast_kukakr120r2500pro(pybind11::module&)::$_0,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::vector<double,std::allocator<double>>const&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg,char[75]>(pybind11_init_ikfast_kukakr120r2500pro(pybind11::module&)::$_0&&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>(*)(std::vector<double,std::allocator<double>>const&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,pybind11::arg_const&,char_const&[])
                ::types,2);
    pybind11::object::~object((object *)&local_58);
    pybind11::object::~object(&local_30);
    pybind11::module::add_object((module *)&local_70,"get_ik",local_78,true);
    pybind11::object::~object((object *)&local_78);
    hVar1.m_ptr = local_70.m_ptr;
    local_50._0_8_ = "joint_list";
    local_50.obj.m_ptr = (PyObject *)((ulong)local_50.obj.m_ptr & 0xfffffffffffffffc | 2);
    local_58.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar4.m_ptr = (PyObject *)PyObject_GetAttrString(local_70.m_ptr,"get_fk");
    if (hVar4.m_ptr == (PyObject *)0x0) {
      PyErr_Clear();
      local_78.m_ptr = (PyObject *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
      hVar4.m_ptr = local_78.m_ptr;
    }
    local_78.m_ptr = hVar4.m_ptr;
    hVar4.m_ptr = local_78.m_ptr;
    local_68.m_ptr = (PyObject *)0x0;
    pfVar3 = pybind11::cpp_function::make_function_record((cpp_function *)&local_68);
    pfVar3->impl = pybind11::cpp_function::
                   initialize<pybind11_init_ikfast_kukakr120r2500pro(pybind11::module&)::$_1,std::tuple<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,std::vector<double,std::allocator<double>>const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,char[64]>(pybind11_init_ikfast_kukakr120r2500pro(pybind11::module&)::$_1&&,std::tuple<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>(*)(std::vector<double,std::allocator<double>>const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,char_const(&)[64])
                   ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    pfVar3->name = "get_fk";
    (pfVar3->scope).m_ptr = hVar1.m_ptr;
    (pfVar3->sibling).m_ptr = hVar4.m_ptr;
    pybind11::detail::process_attribute<pybind11::arg,_void>::init
              ((process_attribute<pybind11::arg,_void> *)&local_50,(EVP_PKEY_CTX *)pfVar3);
    pfVar3->doc = "\n        get forward kinematic solutions for kuka_kr6_r900\n    ";
    pybind11::cpp_function::initialize_generic
              ((cpp_function *)&local_68,pfVar3,
               "({List[float]}) -> Tuple[List[float], List[List[float]]]",
               (type_info **)
               &pybind11::cpp_function::
                initialize<pybind11_init_ikfast_kukakr120r2500pro(pybind11::module&)::$_1,std::tuple<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,std::vector<double,std::allocator<double>>const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,char[64]>(pybind11_init_ikfast_kukakr120r2500pro(pybind11::module&)::$_1&&,std::tuple<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>(*)(std::vector<double,std::allocator<double>>const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,char_const&[])
                ::types,1);
    pybind11::object::~object((object *)&local_78);
    pybind11::object::~object((object *)&local_58);
    pybind11::module::add_object((module *)&local_70,"get_fk",local_68,true);
    pybind11::object::~object((object *)&local_68);
    hVar1.m_ptr = local_70.m_ptr;
    local_78.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar4.m_ptr = (PyObject *)PyObject_GetAttrString(local_70.m_ptr,"get_dof");
    if (hVar4.m_ptr == (PyObject *)0x0) {
      PyErr_Clear();
      local_68.m_ptr = (PyObject *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
      hVar4.m_ptr = local_68.m_ptr;
    }
    local_68.m_ptr = hVar4.m_ptr;
    hVar4.m_ptr = local_68.m_ptr;
    local_50._0_8_ = (PyObject *)0x0;
    pfVar3 = pybind11::cpp_function::make_function_record((cpp_function *)&local_50);
    pfVar3->impl = pybind11::cpp_function::
                   initialize<pybind11_init_ikfast_kukakr120r2500pro(pybind11::module&)::$_2,int,,pybind11::name,pybind11::scope,pybind11::sibling,char[63]>(pybind11_init_ikfast_kukakr120r2500pro(pybind11::module&)::$_2&&,int(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,char_const(&)[63])
                   ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    pfVar3->name = "get_dof";
    (pfVar3->scope).m_ptr = hVar1.m_ptr;
    (pfVar3->sibling).m_ptr = hVar4.m_ptr;
    pfVar3->doc = "\n        get number dofs configured for the ikfast module\n    ";
    pybind11::cpp_function::initialize_generic
              ((cpp_function *)&local_50,pfVar3,"() -> int",
               (type_info **)
               &pybind11::cpp_function::
                initialize<pybind11_init_ikfast_kukakr120r2500pro(pybind11::module&)::$_2,int,,pybind11::name,pybind11::scope,pybind11::sibling,char[63]>(pybind11_init_ikfast_kukakr120r2500pro(pybind11::module&)::$_2&&,int(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,char_const&[])
                ::types,0);
    pybind11::object::~object((object *)&local_68);
    pybind11::object::~object((object *)&local_78);
    pybind11::module::add_object((module *)&local_70,"get_dof",(handle)local_50._0_8_,true);
    pybind11::object::~object((object *)&local_50);
    hVar1.m_ptr = local_70.m_ptr;
    local_78.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar4.m_ptr = (PyObject *)PyObject_GetAttrString(local_70.m_ptr,"get_free_dof");
    if (hVar4.m_ptr == (PyObject *)0x0) {
      PyErr_Clear();
      local_68.m_ptr = (PyObject *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
      hVar4.m_ptr = local_68.m_ptr;
    }
    local_68.m_ptr = hVar4.m_ptr;
    hVar4.m_ptr = local_68.m_ptr;
    local_50._0_8_ = (PyObject *)0x0;
    pfVar3 = pybind11::cpp_function::make_function_record((cpp_function *)&local_50);
    pfVar3->impl = pybind11::cpp_function::
                   initialize<pybind11_init_ikfast_kukakr120r2500pro(pybind11::module&)::$_3,int,,pybind11::name,pybind11::scope,pybind11::sibling,char[71]>(pybind11_init_ikfast_kukakr120r2500pro(pybind11::module&)::$_3&&,int(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,char_const(&)[71])
                   ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    pfVar3->name = "get_free_dof";
    (pfVar3->scope).m_ptr = hVar1.m_ptr;
    (pfVar3->sibling).m_ptr = hVar4.m_ptr;
    pfVar3->doc = "\n        get number of free dofs configured for the ikfast module\n    ";
    pybind11::cpp_function::initialize_generic
              ((cpp_function *)&local_50,pfVar3,"() -> int",
               (type_info **)
               &pybind11::cpp_function::
                initialize<pybind11_init_ikfast_kukakr120r2500pro(pybind11::module&)::$_3,int,,pybind11::name,pybind11::scope,pybind11::sibling,char[71]>(pybind11_init_ikfast_kukakr120r2500pro(pybind11::module&)::$_3&&,int(*)(),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,char_const&[])
                ::types,0);
    pybind11::object::~object((object *)&local_68);
    pybind11::object::~object((object *)&local_78);
    pybind11::module::add_object((module *)&local_70,"get_free_dof",(handle)local_50._0_8_,true);
    pybind11::object::~object((object *)&local_50);
    local_50.obj.m_ptr = local_70.m_ptr;
    local_50.key = "__version__";
    local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              (&local_50,(char (*) [4])"dev");
    pybind11::object::~object((object *)&local_50.cache.super_handle);
    pybind11::object::~object((object *)&local_70);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    local_70.m_ptr = (PyObject *)0x0;
  }
  return local_70.m_ptr;
}

Assistant:

PYBIND11_MODULE(ikfast_kukakr120r2500pro, m)
{
    m.doc() = R"pbdoc(
        ikfast_pybind_kukakr120r2500pro
        -----------------------
        .. currentmodule:: ikfast_pybind_kukakr120r2500pro
        .. autosummary::
           :toctree: _generate
           get_ik
           get_fk
    )pbdoc";

    m.def("get_ik", [](const std::vector<double> &trans_list,
                       const std::vector<std::vector<double>> &rot_list)
    {
      using namespace ikfast;
      IkSolutionList<double> solutions;

      std::vector<double> vfree(GetNumFreeParameters());
      double eerot[9], eetrans[3];

      for(std::size_t i = 0; i < 3; ++i)
      {
          eetrans[i] = trans_list[i];
          std::vector<double> rot_vec = rot_list[i];
          for(std::size_t j = 0; j < 3; ++j)
          {
              eerot[3*i + j] = rot_vec[j];
          }
      }

      // call ikfast routine
      bool b_success = ComputeIk(eetrans, eerot, &vfree[0], solutions);

      std::vector<std::vector<double>> solution_list;
      if (!b_success)
      {
          //fprintf(stderr,"Failed to get ik solution\n");
          return solution_list; // Equivalent to returning None in python
      }

      std::vector<double> solvalues(GetNumJoints());

      // convert all ikfast solutions into a std::vector
      for(std::size_t i = 0; i < solutions.GetNumSolutions(); ++i)
      {
          const IkSolutionBase<double>& sol = solutions.GetSolution(i);
          std::vector<double> vsolfree(sol.GetFree().size());
          sol.GetSolution(&solvalues[0],
                          vsolfree.size() > 0 ? &vsolfree[0] : NULL);

          std::vector<double> individual_solution = std::vector<double>(GetNumJoints());
          for(std::size_t j = 0; j < solvalues.size(); ++j)
          {
              individual_solution[j] = solvalues[j];
          }
          solution_list.push_back(individual_solution);
      }
      return solution_list;
    },
    py::arg("trans_list"),
    py::arg("rot_list"),
    R"pbdoc(
        get inverse kinematic solutions for pybind_kukakr120r2500pro
    )pbdoc");

    m.def("get_fk", [](const std::vector<double> &joint_list)
    {
      using namespace ikfast;
      // eerot is a flattened 3x3 rotation matrix
      double eerot[9], eetrans[3];

      std::vector<double> joints(GetNumJoints());
      for(std::size_t i = 0; i < GetNumJoints(); ++i)
      {
          joints[i] = joint_list[i];
      }

      // call ikfast routine
      ComputeFk(&joints[0], eetrans, eerot);

      // convert computed EE pose to a python object
      std::vector<double> pos(3);
      std::vector<std::vector<double>> rot(3);

      for(std::size_t i = 0; i < 3; ++i)
      {
          pos[i] = eetrans[i];
          std::vector<double> rot_vec(3);
          for( std::size_t j = 0; j < 3; ++j)
          {
              rot_vec[j] = eerot[3*i + j];
          }
          rot[i] = rot_vec;
      }
      return std::make_tuple(pos, rot);
    },
    py::arg("joint_list"),
    R"pbdoc(
        get forward kinematic solutions for kuka_kr6_r900
    )pbdoc");

    m.def("get_dof", []()
    {
      return int(GetNumJoints());
    },
    R"pbdoc(
        get number dofs configured for the ikfast module
    )pbdoc");

    m.def("get_free_dof", []()
    {
      return int(GetNumFreeParameters());
    },
    R"pbdoc(
        get number of free dofs configured for the ikfast module
    )pbdoc");

#ifdef VERSION_INFO
    m.attr("__version__") = VERSION_INFO;
#else
    m.attr("__version__") = "dev";
#endif

}